

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  time_t tVar8;
  unsigned_long_long uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  char *__format;
  long lVar13;
  FILE *pFVar14;
  uint *puVar15;
  float fVar16;
  ulong local_10c0;
  test_params p;
  ulong local_70;
  unsigned_long_long used_size;
  float local_5c;
  ulong local_58;
  unsigned_long_long local_50;
  void *local_48;
  ulong local_40;
  char local_31;
  on_evict_info info;
  
  local_40 = 0;
  memset(&p.extent_size,0,0x1018);
  local_10c0 = 0x100000;
  p.pool_size = 0x100;
  p.seconds._4_4_ = 1;
  local_50 = 0x46;
  puVar15 = &switchD_001013a0::switchdataD_00102010;
  uVar11 = 0;
  local_48 = (void *)0x0;
LAB_0010137f:
  iVar6 = getopt(argc,argv,"hp:e:v:t:m:o:d:s:n");
  switch(iVar6) {
  case 100:
    if (*_optarg != '\0') {
      strcpy((char *)&p.val_max,_optarg);
      goto LAB_0010137f;
    }
    argerror("invalid dir argument\n",*argv);
LAB_0010188a:
    argerror("missing required dir argument\n",*argv);
    break;
  case 0x65:
    p.pool_size = parse_ull("extent size",*argv);
    goto LAB_0010137f;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x71:
  case 0x72:
  case 0x75:
switchD_001013a0_caseD_66:
    argerror("",*argv);
switchD_001013a0_caseD_68:
    printf("usage: %s -d <dir> [-p <pool_size>] [-e <extent_size>] [-v <val_max_factor>] [-t <timeout_seconds>] [-m <timeout_minutes>] [-o <timeout_hours>] [-s <seed_for_rand>] [-n] [-h]\n\t n  -  do not print out csv output (it is printed by default)\n"
           ,*argv);
    exit(0);
  case 0x68:
    goto switchD_001013a0_caseD_68;
  case 0x6d:
    uVar7 = parse_unsigned("minutes",*argv);
    uVar11 = (ulong)uVar7;
    goto LAB_0010137f;
  case 0x6e:
    p.seconds._4_4_ = 0;
    goto LAB_0010137f;
  case 0x6f:
    uVar7 = parse_unsigned("hours",*argv);
    local_48 = (void *)(ulong)uVar7;
    goto LAB_0010137f;
  case 0x70:
    local_10c0 = parse_ull("pool size",*argv);
    goto LAB_0010137f;
  case 0x73:
    p.seconds._0_4_ = parse_unsigned("seed for rand()",*argv);
    goto LAB_0010137f;
  case 0x74:
    uVar7 = parse_unsigned("seconds",*argv);
    local_40 = (ulong)uVar7;
    goto LAB_0010137f;
  case 0x76:
    goto switchD_001013a0_caseD_76;
  default:
    if (iVar6 != -1) goto switchD_001013a0_caseD_66;
    if ((char)p.val_max == '\0') goto LAB_0010188a;
    p.dir._4088_8_ = (long)local_48 * 0xe10 + uVar11 * 0x3c + local_40;
    puVar15 = (uint *)&p.val_max;
    if (p.dir._4088_8_ != 0) {
      p.extent_size = local_50 * p.pool_size;
      if ((uint)p.seconds == 0) {
        tVar8 = time((time_t *)0x0);
        p.seconds._0_4_ = (uint)tVar8;
      }
      srand((uint)p.seconds);
      printf("seed = %u\n",(ulong)(uint)p.seconds);
      uVar9 = vmemcache_new();
      vmemcache_set_size(uVar9,local_10c0);
      vmemcache_set_extent_size(uVar9,p.pool_size);
      vmemcache_set_eviction_policy(uVar9,1);
      iVar6 = vmemcache_add(uVar9,puVar15);
      if (iVar6 != 0) goto LAB_001018a8;
      local_31 = '\0';
      vmemcache_callback_on_evict(uVar9,on_evict);
      if (p.seconds._4_4_ != 0) {
        puts("keynum,ratio");
      }
      sVar4 = p.extent_size;
      local_48 = malloc(p.extent_size);
      if (local_48 == (void *)0x0) {
        fprintf(_stderr,"malloc: cannot allocate memory (%zu bytes)\n",sVar4);
        iVar6 = 1;
        goto LAB_00101795;
      }
      local_58 = 0;
      tVar8 = time((time_t *)0x0);
      local_50 = tVar8 + p.dir._4088_8_;
      local_40 = local_40 & 0xffffffff00000000;
      lVar13 = 0;
      used_size = uVar9;
      goto LAB_001015ba;
    }
  }
  argerror("timeout must be greater than 0\n",*argv);
LAB_001018a8:
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_utilization.c"
          ,0x130,"main");
  pFVar14 = _stderr;
  uVar12 = vmemcache_errormsg();
  fprintf(pFVar14,"vmemcache_new: %s (%s)",uVar12,puVar15);
  fputc(10,_stderr);
  abort();
LAB_001015ba:
  tVar8 = time((time_t *)0x0);
  if ((long)local_50 <= tVar8) {
    if (p.seconds._4_4_ == 0) {
      puts("Passed");
    }
    else if ((local_58 & 1) == 0) {
      printf("%zu,%.3f\n",(double)(float)local_40,lVar13 + -1);
    }
    iVar6 = 0;
LAB_0010178c:
    free(local_48);
LAB_00101795:
    vmemcache_delete(uVar9);
    return iVar6;
  }
  uVar7 = sprintf((char *)&p.seed,"%zu",lVar13);
  sVar5 = p.extent_size;
  sVar4 = p.pool_size;
  if ((int)uVar7 < 0) {
    fprintf(_stderr,"sprintf return value: %d\n",(ulong)uVar7);
LAB_0010184b:
    iVar6 = 1;
    goto LAB_0010178c;
  }
  iVar6 = rand();
  uVar9 = used_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(auVar3 / auVar1,0);
  iVar6 = vmemcache_put(used_size,&p.seed,uVar7,local_48,
                        ((ulong)(long)iVar6 /
                         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar2,0) + 1U) + 1) *
                        sVar4);
  pFVar14 = _stderr;
  if (iVar6 != 0) {
    uVar12 = vmemcache_errormsg();
    __format = "vmemcache_put: %s\n";
LAB_0010181e:
    fprintf(pFVar14,__format,uVar12);
    goto LAB_0010184b;
  }
  iVar6 = vmemcache_get_stat(uVar9,7,&local_70,8);
  pFVar14 = _stderr;
  if (iVar6 != 0) {
    uVar12 = vmemcache_errormsg();
    __format = "vmemcache_get_stat: %s\n";
    goto LAB_0010181e;
  }
  uVar11 = local_10c0;
  if ((long)local_10c0 < 0) {
    uVar11 = local_10c0 >> 1;
  }
  fVar16 = (float)local_70 / (float)local_10c0;
  local_40 = CONCAT44(local_40._4_4_,fVar16);
  if (p.seconds._4_4_ != 0) {
    if (lVar13 != 0) {
      uVar10 = lroundf(fVar16 * 100.0);
      uVar11 = lroundf(local_5c * 100.0);
      fVar16 = (float)local_40;
      if (uVar10 == uVar11) {
        local_58 = 0;
        goto LAB_0010172f;
      }
    }
    local_58 = CONCAT71((int7)(uVar11 >> 8),1);
    printf("%zu,%.3f\n",(double)fVar16,lVar13);
    local_5c = (float)local_40;
    fVar16 = (float)local_40;
  }
LAB_0010172f:
  if ((local_31 == '\x01') && (fVar16 < 0.87)) {
    fprintf(_stderr,"insufficient space utilization. ratio: %.3f: seed %u\n",(ulong)(uint)p.seconds)
    ;
    goto LAB_0010184b;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001015ba;
switchD_001013a0_caseD_76:
  local_50 = parse_ull("val max factor",*argv);
  goto LAB_0010137f;
}

Assistant:

int
main(int argc, char **argv)
{
	test_params p = parse_args(argc, argv);

	VMEMcache *vc = vmemcache_new();
	vmemcache_set_size(vc, p.pool_size);
	vmemcache_set_extent_size(vc, p.extent_size);
	vmemcache_set_eviction_policy(vc, VMEMCACHE_REPLACEMENT_LRU);
	if (vmemcache_add(vc, p.dir))
		UT_FATAL("vmemcache_new: %s (%s)", vmemcache_errormsg(), p.dir);

	int ret = put_until_timeout(vc, &p);

	vmemcache_delete(vc);

	return ret;
}